

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_timidity.cpp
# Opt level: O2

bool TimidityPPMIDIDevice::FillStream(SoundStream *stream,void *buff,int len,void *userdata)

{
  int iVar1;
  int iVar2;
  uint __i;
  long lVar3;
  ssize_t sVar4;
  size_t __nbytes;
  timeval tv;
  fd_set rfds;
  
  iVar2 = ChildQuit;
  iVar1 = *(int *)((long)userdata + 0x28);
  if (ChildQuit == iVar1) {
    ChildQuit = 0;
    fwrite("child gone\n",0xb,1,_stderr);
    *(undefined4 *)((long)userdata + 0x28) = 0xffffffff;
  }
  else {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      rfds.fds_bits[lVar3] = 0;
    }
    rfds.fds_bits[*(int *)((long)userdata + 0x20) / 0x40] =
         rfds.fds_bits[*(int *)((long)userdata + 0x20) / 0x40] |
         1L << ((byte)*(int *)((long)userdata + 0x20) & 0x3f);
    tv.tv_sec = 0;
    tv.tv_usec = 0x32;
    select(1,(fd_set *)&rfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
    __nbytes = (size_t)len;
    sVar4 = read(*(int *)((long)userdata + 0x20),buff,__nbytes);
    if (__nbytes - sVar4 != 0 && sVar4 <= (long)__nbytes) {
      memset((void *)((long)buff + sVar4),0,__nbytes - sVar4);
    }
  }
  return iVar2 != iVar1;
}

Assistant:

bool TimidityPPMIDIDevice::FillStream(SoundStream *stream, void *buff, int len, void *userdata)
{
	TimidityPPMIDIDevice *song = (TimidityPPMIDIDevice *)userdata;
	
#ifdef _WIN32
	DWORD avail, got, didget;

	if (!PeekNamedPipe(song->ReadWavePipe, NULL, 0, NULL, &avail, NULL) || avail == 0)
	{ // If nothing is available from the pipe, play silence.
		memset (buff, 0, len);
	}
	else
	{
		didget = 0;
		for (;;)
		{
			ReadFile(song->ReadWavePipe, (BYTE *)buff+didget, len-didget, &got, NULL);
			didget += got;
			if (didget >= (DWORD)len)
				break;

			// Give TiMidity++ a chance to output something more to the pipe
			Sleep (10);
			if (!PeekNamedPipe(song->ReadWavePipe, NULL, 0, NULL, &avail, NULL) || avail == 0)
			{
				memset ((BYTE *)buff+didget, 0, len-didget);
				break;
			}
		} 
	}
#else
	ssize_t got;
	fd_set rfds;
	struct timeval tv;

	if (ChildQuit == song->ChildProcess)
	{
		ChildQuit = 0;
		fprintf(stderr, "child gone\n");
		song->ChildProcess = -1;
		return false;
	}

	FD_ZERO(&rfds);
	FD_SET(song->WavePipe[0], &rfds);
	tv.tv_sec = 0;
	tv.tv_usec = 50;
//	fprintf(stderr,"select\n");
	if (select(1, &rfds, NULL, NULL, &tv) <= 0 && 0)
	{ // Nothing available, so play silence.
//	fprintf(stderr,"nothing\n");
	 //   memset(buff, 0, len);
	    return true;
	}
//	fprintf(stderr,"something\n");

	got = read(song->WavePipe[0], (BYTE *)buff, len);
	if (got < len)
	{
		memset((BYTE *)buff+got, 0, len-got);
	}
#endif
	return true;
}